

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O0

void __thiscall embree::XMLWriter::store(XMLWriter *this,Ref<embree::SceneGraph::Node> *node)

{
  mapped_type_conflict1 mVar1;
  PerspectiveCameraNode *pPVar2;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> RVar3;
  bool bVar4;
  mapped_type_conflict1 *pmVar5;
  ostream *poVar6;
  XMLWriter *this_00;
  runtime_error *this_01;
  long *in_RSI;
  long in_RDI;
  undefined1 uVar7;
  undefined1 uVar8;
  Ref<embree::SceneGraph::GroupNode> cnode_9;
  Ref<embree::SceneGraph::TransformNode> cnode_8;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cnode_7;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> cnode_6;
  Ref<embree::SceneGraph::HairSetNode> cnode_5;
  Ref<embree::SceneGraph::SubdivMeshNode> cnode_4;
  Ref<embree::SceneGraph::QuadMeshNode> cnode_3;
  Ref<embree::SceneGraph::TriangleMeshNode> cnode_2;
  Ref<embree::SceneGraph::LightNode> cnode_1;
  Ref<embree::SceneGraph::AnimatedLightNode> cnode;
  ssize_t id;
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  *in_stack_fffffffffffff8a8;
  XMLWriter *in_stack_fffffffffffff8b0;
  ssize_t in_stack_fffffffffffff8b8;
  Ref<embree::SceneGraph::PerspectiveCameraNode> *in_stack_fffffffffffff8c0;
  XMLWriter *in_stack_fffffffffffff8c8;
  key_type *in_stack_fffffffffffff8e8;
  map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
  *in_stack_fffffffffffff8f0;
  long *local_680;
  long *local_648;
  long *local_610;
  long *local_5d8;
  ssize_t in_stack_fffffffffffffa40;
  Ref<embree::SceneGraph::AnimatedLightNode> *in_stack_fffffffffffffa48;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  XMLWriter *in_stack_fffffffffffffa58;
  XMLWriter *this_02;
  long *local_5a0;
  undefined7 in_stack_fffffffffffffa88;
  ssize_t in_stack_fffffffffffffa90;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *camera;
  Ref<embree::SceneGraph::LightNode> *in_stack_fffffffffffffa98;
  XMLWriter *in_stack_fffffffffffffaa0;
  Ref<embree::SceneGraph::GroupNode> *group;
  XMLWriter *in_stack_fffffffffffffaa8;
  long *local_530;
  XMLWriter *local_4f8;
  long *local_4c0;
  long *local_488;
  long *local_458;
  long *local_450;
  long *local_448;
  long *local_440;
  long *local_438;
  long *local_430;
  long *local_428;
  long *local_420;
  long *local_418;
  undefined1 local_410 [8];
  XMLWriter *local_408;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_400;
  long *local_3f8;
  Ref<embree::SceneGraph::HairSetNode> *in_stack_fffffffffffffc18;
  XMLWriter *pXVar9;
  long *local_3d8;
  long *local_3d0;
  long *local_3c8 [3];
  long *local_3b0;
  mapped_type_conflict1 local_3a8;
  _Self local_3a0;
  _Self local_398 [4];
  long **local_378;
  long **local_370;
  long **local_368;
  long **local_358;
  long **local_330;
  long **local_328;
  long **local_320;
  long **local_318;
  long **local_310;
  long **local_300;
  long **local_2e8;
  long **local_2e0;
  long **local_2d8;
  long **local_2d0;
  long **local_2c8;
  long **local_2b8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_270;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  long **local_240;
  long **local_238;
  undefined1 *local_228;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *local_210;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *local_208;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *local_200;
  XMLWriter **local_1f8;
  XMLWriter **local_1f0;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  long **local_1b0;
  long **local_1a8;
  undefined1 *local_198;
  long **local_180;
  long **local_178;
  long **local_170;
  long **local_168;
  long **local_160;
  long **local_150;
  long **local_138;
  long **local_130;
  long **local_128;
  long **local_120;
  long **local_118;
  long **local_108;
  long **local_f8;
  long **local_f0;
  long **local_e0;
  long **local_d8;
  long **local_d0;
  long **local_c8;
  long **local_c0;
  long **local_b0;
  long *local_a0;
  long **local_98;
  long *local_90;
  long **local_88;
  long *local_80;
  long **local_78;
  XMLWriter *local_70;
  undefined1 *local_68;
  long *local_60;
  undefined1 *local_58;
  XMLWriter *local_50;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> *local_48;
  long *local_40;
  XMLWriter *local_38;
  long *local_30;
  long **local_28;
  long *local_20;
  long **local_18;
  long *local_10;
  long **local_8;
  
  local_398[0]._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
       ::find(in_stack_fffffffffffff8a8,(key_type *)0x3ef57b);
  local_3a0._M_node =
       (_Base_ptr)
       std::
       map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
       ::end(in_stack_fffffffffffff8a8);
  bVar4 = std::operator!=(local_398,&local_3a0);
  if (bVar4) {
    tab(in_stack_fffffffffffff8b0);
    poVar6 = std::operator<<((ostream *)(in_RDI + 0x10),"<ref id=\"");
    pmVar5 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
             ::operator[](in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pmVar5);
    poVar6 = std::operator<<(poVar6,"\"/>");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  else {
    mVar1 = *(mapped_type_conflict1 *)(in_RDI + 0x428);
    *(mapped_type_conflict1 *)(in_RDI + 0x428) = mVar1 + 1;
    pmVar5 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_unsigned_long,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_unsigned_long>_>_>
             ::operator[](in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
    *pmVar5 = mVar1;
    local_3a8 = mVar1;
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
    if (bVar4) {
      tab(in_stack_fffffffffffff8b0);
      poVar6 = std::operator<<((ostream *)(in_RDI + 0x10),"<extern id=\"");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_3a8);
      poVar6 = std::operator<<(poVar6,"\" src=\"");
      poVar6 = std::operator<<(poVar6,(string *)(*in_RSI + 0x10));
      poVar6 = std::operator<<(poVar6,"\"/>");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    else {
      local_330 = &local_3b0;
      if (*in_RSI == 0) {
        local_488 = (long *)0x0;
      }
      else {
        local_488 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                           &SceneGraph::AnimatedLightNode::typeinfo,0);
      }
      local_88 = &local_3b0;
      local_90 = local_488;
      local_3b0 = local_488;
      if (local_488 != (long *)0x0) {
        (**(code **)(*local_488 + 0x10))();
      }
      local_328 = &local_3b0;
      if (local_3b0 == (long *)0x0) {
        local_2e8 = &local_3d0;
        if (*in_RSI == 0) {
          local_4c0 = (long *)0x0;
        }
        else {
          local_4c0 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                             &SceneGraph::LightNode::typeinfo,0);
        }
        local_78 = &local_3d0;
        local_80 = local_4c0;
        local_3d0 = local_4c0;
        if (local_4c0 != (long *)0x0) {
          (**(code **)(*local_4c0 + 0x10))();
        }
        local_2e0 = &local_3d0;
        if (local_3d0 == (long *)0x0) {
          local_2a0 = &stack0xfffffffffffffc20;
          if (*in_RSI == 0) {
            local_4f8 = (XMLWriter *)0x0;
          }
          else {
            local_4f8 = (XMLWriter *)
                        __dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                       &SceneGraph::TriangleMeshNode::typeinfo,0);
          }
          local_68 = &stack0xfffffffffffffc20;
          local_70 = local_4f8;
          if (local_4f8 != (XMLWriter *)0x0) {
            (**(code **)(*(long *)local_4f8 + 0x10))();
          }
          local_298 = &stack0xfffffffffffffc20;
          pXVar9 = local_4f8;
          if (local_4f8 == (XMLWriter *)0x0) {
            local_258 = &stack0xfffffffffffffc10;
            if (*in_RSI == 0) {
              local_530 = (long *)0x0;
            }
            else {
              local_530 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                 &SceneGraph::QuadMeshNode::typeinfo,0);
              pXVar9 = local_4f8;
            }
            local_58 = &stack0xfffffffffffffc10;
            local_60 = local_530;
            if (local_530 != (long *)0x0) {
              (**(code **)(*local_530 + 0x10))();
            }
            local_250 = &stack0xfffffffffffffc10;
            if (local_530 == (long *)0x0) {
              local_210 = &local_400;
              group = (Ref<embree::SceneGraph::GroupNode> *)*in_RSI;
              if (group == (Ref<embree::SceneGraph::GroupNode> *)0x0) {
                this_00 = (XMLWriter *)0x0;
              }
              else {
                this_00 = (XMLWriter *)
                          __dynamic_cast(group,&SceneGraph::Node::typeinfo,
                                         &SceneGraph::SubdivMeshNode::typeinfo,0);
              }
              camera = &local_400;
              local_50 = this_00;
              local_48 = camera;
              RVar3.ptr = (AnimatedPerspectiveCameraNode *)this_00;
              if (this_00 != (XMLWriter *)0x0) {
                pPVar2 = &(local_400.ptr)->super_PerspectiveCameraNode;
                local_400.ptr = (AnimatedPerspectiveCameraNode *)this_00;
                (*(pPVar2->super_Node).super_RefCount._vptr_RefCount[2])();
                RVar3.ptr = local_400.ptr;
              }
              local_400.ptr = RVar3.ptr;
              local_208 = &local_400;
              uVar7 = (XMLWriter *)local_400.ptr != (XMLWriter *)0x0;
              if ((bool)uVar7) {
                local_1f8 = &local_408;
                local_200 = &local_400;
                local_408 = (XMLWriter *)local_400.ptr;
                if ((XMLWriter *)local_400.ptr != (XMLWriter *)0x0) {
                  (*((local_400.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                    _vptr_RefCount[2])();
                }
                store(in_stack_fffffffffffffa58,
                      (Ref<embree::SceneGraph::SubdivMeshNode> *)
                      CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                      (ssize_t)in_stack_fffffffffffffa48);
                local_1f0 = &local_408;
                if (local_408 != (XMLWriter *)0x0) {
                  (**(code **)(*(long *)local_408 + 0x18))();
                }
              }
              else {
                local_1c8 = local_410;
                if (*in_RSI == 0) {
                  local_5a0 = (long *)0x0;
                }
                else {
                  local_5a0 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                     &SceneGraph::HairSetNode::typeinfo,0);
                }
                this_02 = (XMLWriter *)local_410;
                local_40 = local_5a0;
                local_410 = (undefined1  [8])local_5a0;
                local_38 = this_02;
                if (local_5a0 != (long *)0x0) {
                  (**(code **)(*local_5a0 + 0x10))();
                }
                local_1c0 = local_410;
                uVar8 = local_410 != (undefined1  [8])0x0;
                if ((bool)uVar8) {
                  local_1b0 = &local_418;
                  local_1b8 = local_410;
                  local_418 = (long *)local_410;
                  if (local_410 != (undefined1  [8])0x0) {
                    (**(code **)(*(long *)local_410 + 0x10))();
                  }
                  store(pXVar9,in_stack_fffffffffffffc18,(ssize_t)local_530);
                  local_1a8 = &local_418;
                  if (local_418 != (long *)0x0) {
                    (**(code **)(*local_418 + 0x18))();
                  }
                }
                else {
                  local_180 = &local_420;
                  if (*in_RSI == 0) {
                    local_5d8 = (long *)0x0;
                  }
                  else {
                    local_5d8 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                       &SceneGraph::AnimatedPerspectiveCameraNode::
                                                        typeinfo,0);
                  }
                  local_28 = &local_420;
                  local_30 = local_5d8;
                  local_420 = local_5d8;
                  if (local_5d8 != (long *)0x0) {
                    (**(code **)(*local_5d8 + 0x10))();
                  }
                  local_178 = &local_420;
                  if (local_420 == (long *)0x0) {
                    local_138 = &local_430;
                    if (*in_RSI == 0) {
                      local_610 = (long *)0x0;
                    }
                    else {
                      local_610 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                         &SceneGraph::PerspectiveCameraNode::
                                                          typeinfo,0);
                    }
                    local_18 = &local_430;
                    local_20 = local_610;
                    local_430 = local_610;
                    if (local_610 != (long *)0x0) {
                      (**(code **)(*local_610 + 0x10))();
                    }
                    local_130 = &local_430;
                    if (local_430 == (long *)0x0) {
                      local_378 = &local_440;
                      if (*in_RSI == 0) {
                        local_648 = (long *)0x0;
                      }
                      else {
                        local_648 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                           &SceneGraph::TransformNode::typeinfo,0);
                      }
                      local_98 = &local_440;
                      local_a0 = local_648;
                      local_440 = local_648;
                      if (local_648 != (long *)0x0) {
                        (**(code **)(*local_648 + 0x10))();
                      }
                      local_370 = &local_440;
                      if (local_440 == (long *)0x0) {
                        local_e0 = &local_450;
                        if (*in_RSI == 0) {
                          local_680 = (long *)0x0;
                        }
                        else {
                          local_680 = (long *)__dynamic_cast(*in_RSI,&SceneGraph::Node::typeinfo,
                                                             &SceneGraph::GroupNode::typeinfo,0);
                        }
                        local_8 = &local_450;
                        local_10 = local_680;
                        local_450 = local_680;
                        if (local_680 != (long *)0x0) {
                          (**(code **)(*local_680 + 0x10))();
                        }
                        local_d8 = &local_450;
                        if (local_450 == (long *)0x0) {
                          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error(this_01,"unknown node type");
                          __cxa_throw(this_01,&std::runtime_error::typeinfo,
                                      std::runtime_error::~runtime_error);
                        }
                        local_c8 = &local_458;
                        local_d0 = &local_450;
                        local_458 = local_450;
                        if (local_450 != (long *)0x0) {
                          (**(code **)(*local_450 + 0x10))();
                        }
                        store(in_stack_fffffffffffffaa8,group,(ssize_t)this_00);
                        local_c0 = &local_458;
                        if (local_458 != (long *)0x0) {
                          (**(code **)(*local_458 + 0x18))();
                        }
                        local_b0 = &local_450;
                        if (local_450 != (long *)0x0) {
                          (**(code **)(*local_450 + 0x18))();
                        }
                      }
                      else {
                        local_f0 = &local_448;
                        local_f8 = &local_440;
                        local_448 = local_440;
                        if (local_440 != (long *)0x0) {
                          (**(code **)(*local_440 + 0x10))();
                        }
                        store(this_02,(Ref<embree::SceneGraph::TransformNode> *)
                                      CONCAT17(uVar8,in_stack_fffffffffffffa50),
                              (ssize_t)in_stack_fffffffffffffa48);
                        local_368 = &local_448;
                        if (local_448 != (long *)0x0) {
                          (**(code **)(*local_448 + 0x18))();
                        }
                      }
                      local_358 = &local_440;
                      if (local_440 != (long *)0x0) {
                        (**(code **)(*local_440 + 0x18))();
                      }
                    }
                    else {
                      local_120 = &local_438;
                      local_128 = &local_430;
                      local_438 = local_430;
                      if (local_430 != (long *)0x0) {
                        (**(code **)(*local_430 + 0x10))();
                      }
                      store(in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0,
                            in_stack_fffffffffffff8b8);
                      local_118 = &local_438;
                      if (local_438 != (long *)0x0) {
                        (**(code **)(*local_438 + 0x18))();
                      }
                    }
                    local_108 = &local_430;
                    if (local_430 != (long *)0x0) {
                      (**(code **)(*local_430 + 0x18))();
                    }
                  }
                  else {
                    local_168 = &local_428;
                    local_170 = &local_420;
                    local_428 = local_420;
                    if (local_420 != (long *)0x0) {
                      (**(code **)(*local_420 + 0x10))();
                    }
                    store(this_00,camera,CONCAT17(uVar7,in_stack_fffffffffffffa88));
                    local_160 = &local_428;
                    if (local_428 != (long *)0x0) {
                      (**(code **)(*local_428 + 0x18))();
                    }
                  }
                  local_150 = &local_420;
                  if (local_420 != (long *)0x0) {
                    (**(code **)(*local_420 + 0x18))();
                  }
                }
                local_198 = local_410;
                if (local_410 != (undefined1  [8])0x0) {
                  (**(code **)(*(long *)local_410 + 0x18))();
                }
              }
              local_1e0 = &local_400;
              if ((XMLWriter *)local_400.ptr != (XMLWriter *)0x0) {
                (*((local_400.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount.
                  _vptr_RefCount[3])();
              }
            }
            else {
              local_240 = &local_3f8;
              local_248 = &stack0xfffffffffffffc10;
              local_3f8 = local_530;
              if (local_530 != (long *)0x0) {
                (**(code **)(*local_530 + 0x10))();
              }
              store(in_stack_fffffffffffffa58,
                    (Ref<embree::SceneGraph::QuadMeshNode> *)
                    CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                    (ssize_t)in_stack_fffffffffffffa48);
              local_238 = &local_3f8;
              if (local_3f8 != (long *)0x0) {
                (**(code **)(*local_3f8 + 0x18))();
              }
            }
            local_228 = &stack0xfffffffffffffc10;
            if (local_530 != (long *)0x0) {
              (**(code **)(*local_530 + 0x18))();
            }
          }
          else {
            local_288 = &stack0xfffffffffffffc18;
            local_290 = &stack0xfffffffffffffc20;
            if (local_4f8 != (XMLWriter *)0x0) {
              (**(code **)(*(long *)local_4f8 + 0x10))();
            }
            store(in_stack_fffffffffffffa58,
                  (Ref<embree::SceneGraph::TriangleMeshNode> *)
                  CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
                  (ssize_t)in_stack_fffffffffffffa48);
            local_280 = &stack0xfffffffffffffc18;
            if (local_4f8 != (XMLWriter *)0x0) {
              (**(code **)(*(long *)local_4f8 + 0x18))();
            }
          }
          local_270 = &stack0xfffffffffffffc20;
          if (pXVar9 != (XMLWriter *)0x0) {
            (**(code **)(*(long *)pXVar9 + 0x18))();
          }
        }
        else {
          local_2d0 = &local_3d8;
          local_2d8 = &local_3d0;
          local_3d8 = local_3d0;
          if (local_3d0 != (long *)0x0) {
            (**(code **)(*local_3d0 + 0x10))();
          }
          store(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
          local_2c8 = &local_3d8;
          if (local_3d8 != (long *)0x0) {
            (**(code **)(*local_3d8 + 0x18))();
          }
        }
        local_2b8 = &local_3d0;
        if (local_3d0 != (long *)0x0) {
          (**(code **)(*local_3d0 + 0x18))();
        }
      }
      else {
        local_318 = local_3c8;
        local_320 = &local_3b0;
        local_3c8[0] = local_3b0;
        if (local_3b0 != (long *)0x0) {
          (**(code **)(*local_3b0 + 0x10))();
        }
        store((XMLWriter *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50),
              in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
        local_310 = local_3c8;
        if (local_3c8[0] != (long *)0x0) {
          (**(code **)(*local_3c8[0] + 0x18))();
        }
      }
      local_300 = &local_3b0;
      if (local_3b0 != (long *)0x0) {
        (**(code **)(*local_3b0 + 0x18))();
      }
    }
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<SceneGraph::Node> node)
  {
    if (nodeMap.find(node) != nodeMap.end()) {
      tab(); xml << "<ref id=\"" << nodeMap[node] << "\"/>" << std::endl; return;
    }
    
    const ssize_t id = nodeMap[node] = currentNodeID++;
    if (node->fileName != "") {
      tab(); xml << "<extern id=\"" << id << "\" src=\"" << node->fileName << "\"/>" << std::endl; return;
    }

    if      (Ref<SceneGraph::AnimatedLightNode> cnode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) store(cnode,id);
    else if (Ref<SceneGraph::LightNode> cnode = node.dynamicCast<SceneGraph::LightNode>()) store(cnode,id);
    //else if (Ref<SceneGraph::MaterialNode> cnode = node.dynamicCast<SceneGraph::MaterialNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TriangleMeshNode> cnode = node.dynamicCast<SceneGraph::TriangleMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::QuadMeshNode> cnode = node.dynamicCast<SceneGraph::QuadMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::SubdivMeshNode> cnode = node.dynamicCast<SceneGraph::SubdivMeshNode>()) store(cnode,id);
    else if (Ref<SceneGraph::HairSetNode> cnode = node.dynamicCast<SceneGraph::HairSetNode>()) store(cnode,id);
    else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::PerspectiveCameraNode> cnode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>()) store(cnode,id);
    else if (Ref<SceneGraph::TransformNode> cnode = node.dynamicCast<SceneGraph::TransformNode>()) store(cnode,id);
    else if (Ref<SceneGraph::GroupNode> cnode = node.dynamicCast<SceneGraph::GroupNode>()) store(cnode,id);
    else throw std::runtime_error("unknown node type");
  }